

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::buyCards(Player *this)

{
  DynastyDeck *this_00;
  Stronghold *this_01;
  _List_node_base *p_Var1;
  DynastyDeck *this_02;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Type TVar6;
  ostream *poVar7;
  BlackCard *this_03;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar8;
  BlackCard *card;
  string *psVar9;
  long *plVar10;
  long lVar11;
  char *pcVar12;
  _List_node_base *p_Var13;
  char ans;
  string buy;
  char local_a9;
  Player *local_a8;
  DynastyDeck *local_a0;
  string local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  DynastyDeck *local_58;
  DynastyDeck *local_50;
  list<Card_*,_std::allocator<Card_*>_> local_48;
  
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_a8 = this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Do you want to buy a card?",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Enter y for yes, n for no",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_a9);
  this_00 = &local_a8->provinces;
  local_58 = &local_a8->army;
  local_a0 = &local_a8->holdings;
  local_50 = &local_a8->dynDeck;
  do {
    if (local_a9 != 'y') {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter name of province to buy",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_78);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_78,local_78 + local_70);
    this_03 = DynastyDeck::searchDeck(this_00,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    lVar11 = 0x10;
    if ((this_03 == (BlackCard *)0x0) || (bVar2 = BlackCard::isRevealed(this_03), !bVar2)) {
      pcVar12 = "Invalid province";
LAB_00109763:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      plVar10 = &std::cout;
    }
    else {
      iVar3 = Stronghold::getMoney(local_a8->stronghold);
      iVar4 = (*(this_03->super_Card)._vptr_Card[4])(this_03);
      pcVar12 = "Not enough money";
      if (iVar3 < iVar4) goto LAB_00109763;
      iVar3 = local_a8->honour;
      iVar4 = (*(this_03->super_Card)._vptr_Card[6])(this_03);
      lVar11 = 0x11;
      pcVar12 = "Not enough honour";
      if (iVar3 < iVar4) goto LAB_00109763;
      this_01 = local_a8->stronghold;
      uVar5 = Stronghold::getMoney(this_01);
      iVar3 = (**(this_03->super_Card)._vptr_Card)
                        (this_03,(ulong)uVar5,(ulong)(uint)local_a8->honour);
      Stronghold::setMoney(this_01,iVar3);
      TVar6 = Card::getType(&this_03->super_Card);
      if (TVar6 == HOLDING) {
        DynastyDeck::pushCard(local_a0,this_03);
        Deck::getDeck_abi_cxx11_(&local_48,&local_a0->super_Deck);
        (*(this_03->super_Card)._vptr_Card[5])(this_03,(_List_node_base *)&local_48,this_03);
        p_Var13 = local_48.super__List_base<Card_*,_std::allocator<Card_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        if (local_48.super__List_base<Card_*,_std::allocator<Card_*>_>._M_impl._M_node.
            super__List_node_base._M_next != (_List_node_base *)&local_48) {
          do {
            p_Var1 = (((_List_base<Card_*,_std::allocator<Card_*>_> *)&p_Var13->_M_next)->_M_impl).
                     _M_node.super__List_node_base._M_next;
            operator_delete(p_Var13,0x18);
            p_Var13 = p_Var1;
          } while (p_Var1 != (_List_node_base *)&local_48);
        }
      }
      else {
        DynastyDeck::pushCard(local_58,this_03);
      }
      this_02 = local_50;
      plVar8 = DynastyDeck::getDynDeck_abi_cxx11_(local_50);
      card = DynastyDeck::popCard
                       (this_02,(BlackCard *)
                                (plVar8->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>
                                )._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
      DynastyDeck::pushCard(this_00,card);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bought card ",0xc);
      psVar9 = BlackCard::getName_abi_cxx11_(this_03);
      plVar10 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(psVar9->_M_dataplus)._M_p,
                                   psVar9->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    }
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    if (this_03 != (BlackCard *)0x0) {
      (*(this_03->super_Card)._vptr_Card[3])(this_03);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want to buy more cards?",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Enter y for yes, n for no",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x11a170);
    std::operator>>((istream *)&std::cin,&local_a9);
  } while( true );
}

Assistant:

void Player::buyCards()                                     //player can buy holdings or personalities from his provinces if he wants to
{
    string buy;
    char ans;

    cout << "Do you want to buy a card?"<<endl<<"Enter y for yes, n for no"<<endl;
    cin >> ans;

    //buys selected province if enough money and honour and replaces it with an unrevealed card from dynDeck
    while (ans == 'y')
    {
        cout << "Enter name of province to buy" << endl;
        cin >> buy;

        BlackCard *bought = provinces.searchDeck(buy);           //searches from province with name = buy
        if (bought)
        {
            if (!bought->isRevealed())
                cout <<"Invalid province"<<endl;
            else if (stronghold->getMoney() < bought->getCost())
                cout << "Not enough money" << endl;
            else if (honour < bought->getHonour())
                cout << "Not enough honour" << endl;
            else
            {
                stronghold->setMoney(bought->effectBonus(stronghold->getMoney(), honour));      //pay

                //add it to player's holdings or army
                if (bought->getType() == Card::HOLDING)
                {
                    holdings.pushCard(bought);
                    bought->ChainHoldings(holdings.getDeck(), reinterpret_cast<Holding *>(bought));    //check for chains
                }
                else
                    army.pushCard(bought);

                //replace it with new unrevealed province from dynDeck
                provinces.pushCard(dynDeck.popCard(*dynDeck.getDynDeck().begin()));
                cout << "Bought card " << bought->getName() << endl;
            }
        }
        else
            cout << "Invalid province"<<endl;

        delete bought;

        cout << "Do you want to buy more cards?"<<endl<<"Enter y for yes, n for no"<<endl;
        cin.clear();
        cin >> ans;
    }
    cout<<endl;
}